

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model.c
# Opt level: O0

ngram_file_type_t ngram_file_name_to_type(char *file_name)

{
  int32 iVar1;
  char *local_20;
  char *ext;
  char *file_name_local;
  
  local_20 = strrchr(file_name,0x2e);
  if (local_20 == (char *)0x0) {
    file_name_local._4_4_ = NGRAM_INVALID;
  }
  else {
    iVar1 = strcmp_nocase(local_20,".gz");
    if (iVar1 == 0) {
      do {
        local_20 = local_20 + -1;
        if (local_20 < file_name) break;
      } while (*local_20 != '.');
      if (local_20 < file_name) {
        return NGRAM_INVALID;
      }
    }
    else {
      iVar1 = strcmp_nocase(local_20,".bz2");
      if (iVar1 == 0) {
        do {
          local_20 = local_20 + -1;
          if (local_20 < file_name) break;
        } while (*local_20 != '.');
        if (local_20 < file_name) {
          return NGRAM_INVALID;
        }
      }
    }
    iVar1 = strncmp_nocase(local_20,".ARPA",5);
    if (iVar1 == 0) {
      file_name_local._4_4_ = NGRAM_ARPA;
    }
    else {
      iVar1 = strncmp_nocase(local_20,".DMP",4);
      if ((iVar1 == 0) || (iVar1 = strncmp_nocase(local_20,".BIN",4), iVar1 == 0)) {
        file_name_local._4_4_ = NGRAM_BIN;
      }
      else {
        file_name_local._4_4_ = NGRAM_INVALID;
      }
    }
  }
  return file_name_local._4_4_;
}

Assistant:

ngram_file_type_t
ngram_file_name_to_type(const char *file_name)
{
    const char *ext;

    ext = strrchr(file_name, '.');
    if (ext == NULL) {
        return NGRAM_INVALID;
    }
    if (0 == strcmp_nocase(ext, ".gz")) {
        while (--ext >= file_name) {
            if (*ext == '.')
                break;
        }
        if (ext < file_name) {
            return NGRAM_INVALID;
        }
    }
    else if (0 == strcmp_nocase(ext, ".bz2")) {
        while (--ext >= file_name) {
            if (*ext == '.')
                break;
        }
        if (ext < file_name) {
            return NGRAM_INVALID;
        }
    }
    /* We use strncmp because there might be a .gz on the end. */
    if (0 == strncmp_nocase(ext, ".ARPA", 5))
        return NGRAM_ARPA;
    if (0 == strncmp_nocase(ext, ".DMP", 4)
        || 0 == strncmp_nocase(ext, ".BIN", 4))
        return NGRAM_BIN;
    return NGRAM_INVALID;
}